

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O1

void dec_get_tb_start_pos(int w,int h,com_part_size_t part,int idx,int *pos_x,int *pos_y)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if (part == SIZE_hNx2N) {
    iVar2 = w + 3;
    if (-1 < w) {
      iVar2 = w;
    }
    iVar2 = (iVar2 >> 2) * idx;
  }
  else if (part == SIZE_2NxhN) {
    iVar1 = h + 3;
    if (-1 < h) {
      iVar1 = h;
    }
    iVar1 = (iVar1 >> 2) * idx;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar1 = 0;
    if (part == SIZE_NxN) {
      iVar1 = ((idx / 2) * h) / 2;
      iVar2 = ((idx % 2) * w) / 2;
    }
  }
  *pos_x = iVar2;
  *pos_y = iVar1;
  return;
}

Assistant:

void dec_get_tb_start_pos(int w, int h, com_part_size_t part, int idx, int *pos_x, int *pos_y)
{
    int x = 0, y = 0;

    switch (part) {
    case SIZE_2Nx2N:
        break;
    case SIZE_NxN:
        y = (idx / 2) * h / 2;
        x = (idx % 2) * w / 2;
        break;
    case SIZE_2NxhN:
        y = idx * (h / 4);
        break;
    case SIZE_hNx2N:
        x = idx * (w / 4);
        break;
    default:
        uavs3d_assert(0);
        break;
    }

    *pos_x = x;
    *pos_y = y;
}